

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

int door_in_range(tgestate_t *state,door_t *door)

{
  byte bVar1;
  ushort uVar2;
  
  bVar1 = (door->mappos).u;
  uVar2 = (state->saved_mappos).pos16.u;
  if (uVar2 < (ushort)((ushort)bVar1 * 4 + 3) && (int)((uint)bVar1 * 4 + -3) <= (int)(uint)uVar2) {
    bVar1 = (door->mappos).v;
    uVar2 = (state->saved_mappos).pos16.v;
    return (int)((ushort)((ushort)bVar1 * 4 + 3) <= uVar2 ||
                (int)(uint)uVar2 < (int)((uint)bVar1 * 4 + -3));
  }
  return 1;
}

Assistant:

int door_in_range(tgestate_t *state, const door_t *door)
{
  const int halfdist = 3;

  uint16_t u, v; /* was BC, BC */

  assert(state != NULL);
  assert(door  != NULL);

  u = door->mappos.u * 4;
  if (state->saved_mappos.pos16.u < u - halfdist || state->saved_mappos.pos16.u >= u + halfdist)
    return 1;

  v = door->mappos.v * 4;
  if (state->saved_mappos.pos16.v < v - halfdist || state->saved_mappos.pos16.v >= v + halfdist)
    return 1;

  return 0;
}